

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::NewGap(FlowBuffer *this,int length)

{
  int in_ESI;
  FlowBuffer *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  ClearPreviousData(in_RDI);
  if ((((in_RDI->chunked_ & 1U) != 0) && (-1 < in_RDI->frame_length_)) &&
     (in_RDI->frame_length_ = in_RDI->frame_length_ - in_ESI, in_RDI->frame_length_ < 0)) {
    in_RDI->frame_length_ = 0;
  }
  in_RDI->orig_data_end_ = (const_byteptr)0x0;
  in_RDI->orig_data_begin_ = (const_byteptr)0x0;
  MarkOrCopy((FlowBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void FlowBuffer::NewGap(int length)
	{
	ClearPreviousData();

	if ( chunked_ && frame_length_ >= 0 )
		{
		frame_length_ -= length;
		if ( frame_length_ < 0 )
			frame_length_ = 0;
		}

	orig_data_begin_ = orig_data_end_ = nullptr;
	MarkOrCopy();
	}